

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# offset64_test.cpp
# Opt level: O2

void flatbuffers::tests::Offset64NestedFlatBuffer(void)

{
  bool expval;
  Offset<flatbuffers::String> OVar1;
  Offset<RootTable> OVar2;
  uint *puVar3;
  String *pSVar4;
  uint8_t *puVar5;
  uint8_t *puVar6;
  Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_> nested_root;
  Vector64<uint8_t> *pVVar7;
  RootTable *pRVar8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> nested_data;
  Options local_f8;
  FlatBufferBuilder64 fbb;
  Verifier verifier;
  
  fbb.buf_.allocator_ = (Allocator *)0x0;
  fbb.buf_.own_allocator_ = false;
  fbb.buf_.initial_size_ = 0x400;
  fbb.buf_.max_size_ = 0x7fffffffffffffff;
  fbb.buf_.buffer_minalign_ = 8;
  fbb.length_of_64_bit_region_ = 0;
  fbb.nested = false;
  fbb.finished = false;
  fbb.buf_.reserved_ = 0;
  fbb.buf_.size_ = 0;
  fbb.buf_.buf_ = (uint8_t *)0x0;
  fbb.buf_.cur_._0_6_ = 0;
  fbb.buf_.cur_._6_2_ = 0;
  fbb.buf_.scratch_._0_6_ = 0;
  fbb._78_8_ = 0;
  fbb.minalign_ = 1;
  fbb.force_defaults_ = false;
  fbb.dedup_vtables_ = true;
  fbb.string_pool = (StringOffsetMap *)0x0;
  OVar1 = FlatBufferBuilderImpl<true>::CreateString<flatbuffers::Offset>
                    (&fbb,"nested: some near string");
  OVar2 = CreateRootTable(&fbb,(Offset64<flatbuffers::Vector<unsigned_char,_unsigned_int>_>)0x0,0,
                          (Offset64<flatbuffers::String>)0x0,
                          (Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_>)0x0,OVar1,
                          (Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_>)0x0,
                          (Offset64<flatbuffers::Vector<const_LeafStruct_*,_unsigned_int>_>)0x0,
                          (Offset64<flatbuffers::Vector<const_LeafStruct_*,_unsigned_long>_>)0x0,
                          (Offset<flatbuffers::Vector<flatbuffers::Offset<WrapperTable>,_unsigned_int>_>
                           )0x0,(Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_>)0x0);
  FlatBufferBuilderImpl<true>::Finish<RootTable>(&fbb,OVar2,(char *)0x0);
  puVar3 = (uint *)FlatBufferBuilderImpl<true>::GetBufferPointer(&fbb);
  pSVar4 = RootTable::near_string((RootTable *)((ulong)*puVar3 + (long)puVar3));
  TestEqStr((char *)(pSVar4 + 1),"nested: some near string",
            "\'root_table->near_string()->c_str()\' != \'\"nested: some near string\"\'",
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
            ,0x80,"");
  puVar5 = FlatBufferBuilderImpl<true>::GetBufferPointer(&fbb);
  puVar6 = FlatBufferBuilderImpl<true>::GetBufferPointer(&fbb);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&nested_data,puVar5,
             puVar6 + fbb.buf_.size_,(allocator_type *)&verifier);
  FlatBufferBuilderImpl<true>::Clear(&fbb);
  nested_root = FlatBufferBuilderImpl<true>::CreateVector64<flatbuffers::Vector64,_unsigned_char>
                          (&fbb,&nested_data);
  OVar1 = FlatBufferBuilderImpl<true>::CreateString<flatbuffers::Offset>(&fbb,"some near string");
  OVar2 = CreateRootTable(&fbb,(Offset64<flatbuffers::Vector<unsigned_char,_unsigned_int>_>)0x0,0,
                          (Offset64<flatbuffers::String>)0x0,
                          (Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_>)0x0,OVar1,
                          nested_root,
                          (Offset64<flatbuffers::Vector<const_LeafStruct_*,_unsigned_int>_>)0x0,
                          (Offset64<flatbuffers::Vector<const_LeafStruct_*,_unsigned_long>_>)0x0,
                          (Offset<flatbuffers::Vector<flatbuffers::Offset<WrapperTable>,_unsigned_int>_>
                           )0x0,(Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_>)0x0);
  FlatBufferBuilderImpl<true>::Finish<RootTable>(&fbb,OVar2,(char *)0x0);
  local_f8.max_depth = 0x40;
  local_f8.max_tables = 1000000;
  local_f8.check_alignment = true;
  local_f8.check_nested_flatbuffers = true;
  local_f8.max_size = 0x7fffffffffffffff;
  local_f8.assert = true;
  puVar5 = FlatBufferBuilderImpl<true>::GetBufferPointer(&fbb);
  VerifierTemplate<false>::VerifierTemplate(&verifier,puVar5,fbb.buf_.size_,&local_f8);
  expval = VerifyRootTableBuffer(&verifier);
  TestEq<bool,bool>(expval,true,"\'VerifyRootTableBuffer(verifier)\' != \'true\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
                    ,0xa0,"");
  puVar3 = (uint *)FlatBufferBuilderImpl<true>::GetBufferPointer(&fbb);
  if (puVar3 == (uint *)0x0) {
    pRVar8 = (RootTable *)0x0;
  }
  else {
    pRVar8 = (RootTable *)((ulong)*puVar3 + (long)puVar3);
  }
  pSVar4 = RootTable::near_string(pRVar8);
  TestEqStr((char *)(pSVar4 + 1),"some near string",
            "\'root_table->near_string()->c_str()\' != \'\"some near string\"\'",
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
            ,0xa7,"");
  pVVar7 = RootTable::nested_root(pRVar8);
  TestEq<unsigned_long,unsigned_long>
            (*(unsigned_long *)pVVar7,
             (long)nested_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)nested_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
             "\'root_table->nested_root()->size()\' != \'nested_data.size()\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
             ,0xaa,"");
  pRVar8 = RootTable::nested_root_nested_root(pRVar8);
  pSVar4 = RootTable::near_string(pRVar8);
  TestEqStr((char *)(pSVar4 + 1),"nested: some near string",
            "\'root_table->nested_root_nested_root()->near_string()->c_str()\' != \'\"nested: some near string\"\'"
            ,
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
            ,0xae,"");
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&nested_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  FlatBufferBuilderImpl<true>::~FlatBufferBuilderImpl(&fbb);
  return;
}

Assistant:

void Offset64NestedFlatBuffer() {
  FlatBufferBuilder64 fbb;

  // First serialize a nested buffer.
  const Offset<String> near_string_offset =
      fbb.CreateString("nested: some near string");

  // Finish by building the root table by passing in all the offsets.
  const Offset<RootTable> root_table_offset =
      CreateRootTable(fbb, 0, 0, 0, 0, near_string_offset, 0);

  // Finish the buffer.
  fbb.Finish(root_table_offset);

  // Ensure the buffer is valid.
  const RootTable *root_table = GetRootTable(fbb.GetBufferPointer());
  TEST_EQ_STR(root_table->near_string()->c_str(), "nested: some near string");

  // Copy the data out of the builder.
  std::vector<uint8_t> nested_data{ fbb.GetBufferPointer(),
                                    fbb.GetBufferPointer() + fbb.GetSize() };

  {
    // Clear so we can reuse the builder.
    fbb.Clear();

    const Offset64<Vector64<uint8_t>> nested_flatbuffer_offset =
        fbb.CreateVector64<Vector64>(nested_data);

    // Now that we are done with the 64-bit fields, we can create and add the
    // normal fields.
    const Offset<String> near_string_offset =
        fbb.CreateString("some near string");

    // Finish by building the root table by passing in all the offsets.
    const Offset<RootTable> root_table_offset = CreateRootTable(
        fbb, 0, 0, 0, 0, near_string_offset, nested_flatbuffer_offset);

    // Finish the buffer.
    fbb.Finish(root_table_offset);

    Verifier::Options options;
    // Allow the verifier to verify 64-bit buffers.
    options.max_size = FLATBUFFERS_MAX_64_BUFFER_SIZE;
    options.assert = true;

    Verifier verifier(fbb.GetBufferPointer(), fbb.GetSize(), options);

    TEST_EQ(VerifyRootTableBuffer(verifier), true);
  }

  {
    const RootTable *root_table = GetRootTable(fbb.GetBufferPointer());

    // Test that the parent buffer field is ok.
    TEST_EQ_STR(root_table->near_string()->c_str(), "some near string");

    // Expect nested buffer to be properly sized.
    TEST_EQ(root_table->nested_root()->size(), nested_data.size());

    // Expect the direct accessors to the nested buffer work.
    TEST_EQ_STR(root_table->nested_root_nested_root()->near_string()->c_str(),
                "nested: some near string");
  }
}